

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O3

void clausifyMode(Problem *problem,bool theory)

{
  List<Kernel::Unit_*> **ppLVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  uint uVar5;
  int iVar6;
  ImmediateSimplificationEngine *pIVar7;
  Clause *pCVar8;
  Formula *pFVar9;
  Unit *this;
  ostream *poVar10;
  bool bVar11;
  Unit *unit;
  Unit *unit_00;
  Unit *unit_01;
  Inference *pIVar12;
  undefined7 in_register_00000031;
  ulong in_R8;
  ClauseIterator cit;
  CompositeISE simplifier;
  ScopedPtr<Kernel::Problem> prb;
  Options *in_stack_000000a0;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  void *local_b8;
  string *psStack_b0;
  undefined1 local_a8 [14];
  NonspecificInference0 local_9a;
  CompositeISE local_98;
  Problem *local_78;
  Literal *local_70;
  Literal *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  Entry *pEStack_58;
  SplitSet *local_50;
  void *pvStack_48;
  void *local_40;
  string *in_stack_ffffffffffffffc8;
  
  local_a8._8_4_ = (undefined4)CONCAT71(in_register_00000031,theory);
  local_98.super_ImmediateSimplificationEngine.super_InferenceEngine._salg =
       (SaturationAlgorithm *)0x0;
  local_98.super_ImmediateSimplificationEngine.super_InferenceEngine._vptr_InferenceEngine =
       (_func_int **)&PTR__CompositeISE_00b39898;
  local_98._inners = (ISList *)0x0;
  local_98._innersMany = (ISList *)0x0;
  pIVar7 = (ImmediateSimplificationEngine *)operator_new(0x10);
  (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b39bb8;
  Inferences::CompositeISE::addFront(&local_98,pIVar7);
  pIVar7 = (ImmediateSimplificationEngine *)operator_new(0x18);
  (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b3a928;
  *(undefined1 *)&pIVar7[1].super_InferenceEngine._vptr_InferenceEngine = 1;
  Inferences::CompositeISE::addFront(&local_98,pIVar7);
  pIVar7 = (ImmediateSimplificationEngine *)operator_new(0x10);
  (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b39af8;
  Inferences::CompositeISE::addFront(&local_98,pIVar7);
  if (*(long *)(Lib::env + 0x8d70) != 0) {
    Shell::Options::sampleStrategy(in_stack_000000a0,in_stack_ffffffffffffffc8);
  }
  preprocessProblem(problem);
  local_78 = problem;
  Shell::UIHelper::outputSymbolDeclarations((ostream *)&std::cout);
  Kernel::Problem::clauseIterator((Problem *)local_a8);
  bVar11 = false;
  while( true ) {
    cVar4 = (**(code **)&((*(Unit **)local_a8._0_8_)->_inference).field_0x8)();
    if (cVar4 == '\0') break;
    pCVar8 = (Clause *)(*(code *)((*(Unit **)local_a8._0_8_)->_inference)._splits)();
    pCVar8 = Inferences::CompositeISE::simplify(&local_98,pCVar8);
    if (pCVar8 != (Clause *)0x0) {
      bVar11 = (bool)(bVar11 | ((undefined1  [48])(pCVar8->super_Unit)._inference &
                               (undefined1  [48])0x18) == (undefined1  [48])0x8);
      if (local_a8[8] == '\0') {
        Shell::TPTPPrinter::toString_abi_cxx11_((string *)local_d8,(TPTPPrinter *)pCVar8,unit);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_d8._0_8_,local_d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      }
      else {
        pFVar9 = Kernel::Formula::fromClause(pCVar8);
        pIVar12 = &(pCVar8->super_Unit)._inference;
        if (((uint)*(ulong *)pIVar12 & 0x1c) == 8) {
          *(ulong *)pIVar12 = *(ulong *)pIVar12 | 0xc;
        }
        this = (Unit *)operator_new(0x48,8);
        local_d8._0_8_ = *(undefined8 *)pIVar12;
        local_d8._8_8_ = *(undefined8 *)&(pCVar8->super_Unit)._inference.field_0x8;
        local_c8._M_allocated_capacity = (size_type)(pCVar8->super_Unit)._inference._splits;
        local_c8._8_8_ = (pCVar8->super_Unit)._inference._ptr1;
        local_b8 = (pCVar8->super_Unit)._inference._ptr2;
        psStack_b0 = *(string **)&(pCVar8->super_Unit)._inference.th_ancestors;
        Kernel::Unit::Unit(this,FORMULA,(Inference *)local_d8);
        *(Formula **)(this + 1) = pFVar9;
        *(undefined8 *)&this[1]._inference = 3;
        Kernel::Unit::doUnitTracing(this);
        this->_number = (pCVar8->super_Unit)._number;
        Shell::TPTPPrinter::toString_abi_cxx11_((string *)local_d8,(TPTPPrinter *)this,unit_00);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_d8._0_8_,local_d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_allocated_capacity + 1));
      }
    }
  }
  if ((!bVar11) && (*(char *)(Shell::UIHelper::_loadedPieces._16_8_ + -4) == '\x01')) {
    uVar5 = Kernel::Signature::addFreshPredicate(DAT_00b521b0,0,"p",(char *)0x0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_R8;
    local_70 = Kernel::Literal::create
                         ((Literal *)(ulong)uVar5,1,false,
                          (initializer_list<Kernel::TermList>)(auVar2 << 0x40));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = in_R8;
    local_68 = Kernel::Literal::create
                         ((Literal *)(ulong)uVar5,0,false,
                          (initializer_list<Kernel::TermList>)(auVar3 << 0x40));
    local_9a.inputType = NEGATED_CONJECTURE;
    local_9a.rule = INPUT;
    Kernel::Inference::Inference((Inference *)&local_60,&local_9a);
    psStack_b0 = in_stack_ffffffffffffffc8;
    local_b8 = local_40;
    local_c8._M_allocated_capacity = (size_type)local_50;
    local_c8._8_8_ = pvStack_48;
    local_d8._0_8_ = local_60;
    local_d8._8_8_ = pEStack_58;
    pCVar8 = Kernel::Clause::fromArray(&local_70,2,(Inference *)local_d8);
    Shell::TPTPPrinter::toString_abi_cxx11_((string *)local_d8,(TPTPPrinter *)pCVar8,unit_01);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_d8._0_8_,local_d8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ != &local_c8) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_allocated_capacity + 1));
    }
  }
  local_d8._0_8_ = &local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,*(long *)(Lib::env + 0x6a70),
             *(long *)(Lib::env + 0x6a78) + *(long *)(Lib::env + 0x6a70));
  iVar6 = std::__cxx11::string::compare(local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_allocated_capacity + 1));
  }
  if (iVar6 != 0) {
    outputClausesToLaTeX(problem);
  }
  vampireReturnValue = 0;
  if ((UnitList *)local_a8._0_8_ != (UnitList *)0x0) {
    ppLVar1 = (List<Kernel::Unit_*> **)(local_a8._0_8_ + 8);
    *(int *)ppLVar1 = *(int *)ppLVar1 + -1;
    if (*(int *)ppLVar1 == 0) {
      (**(code **)&(*(Unit **)local_a8._0_8_)->_inference)();
    }
  }
  Kernel::Problem::~Problem(problem);
  operator_delete(problem,0x110);
  Inferences::CompositeISE::~CompositeISE(&local_98);
  return;
}

Assistant:

void clausifyMode(Problem* problem, bool theory)
{
  CompositeISE simplifier;
  simplifier.addFront(new TrivialInequalitiesRemovalISE());
  simplifier.addFront(new TautologyDeletionISE());
  simplifier.addFront(new DuplicateLiteralRemovalISE());

  if (!env.options->strategySamplerFilename().empty()) {
    env.options->sampleStrategy(env.options->strategySamplerFilename());
  }

  ScopedPtr<Problem> prb(preprocessProblem(problem));

  //outputSymbolDeclarations deals with sorts as well for now
  //UIHelper::outputSortDeclarations(std::cout);
  UIHelper::outputSymbolDeclarations(std::cout);

  ClauseIterator cit = prb->clauseIterator();
  bool printed_conjecture = false;
  while (cit.hasNext()) {
    Clause* cl = cit.next();
    cl = simplifier.simplify(cl);
    if (!cl) {
      continue;
    }
    printed_conjecture |= cl->inputType() == UnitInputType::CONJECTURE || cl->inputType() == UnitInputType::NEGATED_CONJECTURE;
    if (theory) {
      Formula* f = Formula::fromClause(cl);

      // CONJECTURE as inputType is evil, as it cannot occur multiple times
      if (cl->inference().inputType() == UnitInputType::CONJECTURE) {
        cl->inference().setInputType(UnitInputType::NEGATED_CONJECTURE);
      }

      FormulaUnit* fu = new FormulaUnit(f,cl->inference()); // we are stealing cl's inference, which is not nice!
      fu->overwriteNumber(cl->number()); // we are also making sure it's number is the same as that of the original (for Kostya from Russia to CASC, with love, and back again)
      std::cout << TPTPPrinter::toString(fu) << "\n";
    } else {
      std::cout << TPTPPrinter::toString(cl) << "\n";
    }
  }
  if(!printed_conjecture && UIHelper::haveConjecture()){
    unsigned p = env.signature->addFreshPredicate(0,"p");
    auto c = Clause::fromLiterals({
        Literal::create(p, /* polarity */ true , {}),
        Literal::create(p, /* polarity */ false, {})
      }, 
      NonspecificInference0(UnitInputType::NEGATED_CONJECTURE,InferenceRule::INPUT));
    std::cout << TPTPPrinter::toString(c) << "\n";
  }

  if (env.options->latexOutput() != "off") { outputClausesToLaTeX(prb.ptr()); }

  //we have successfully output all clauses, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}